

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

double units::getNumberBlock(string *ustring,size_t *index)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  byte bVar6;
  double dVar7;
  size_t ival;
  size_t ind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substr;
  size_t local_60;
  double local_58;
  size_t local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  double local_28;
  
  if (*(ustring->_M_dataplus)._M_p == '(') {
    local_60 = 1;
    bVar3 = segmentcheck(ustring,')',&local_60);
    local_58 = NAN;
    if (bVar3) {
      if (local_60 == 2) {
        *index = 2;
        dVar7 = 1.0;
        bVar3 = false;
      }
      else {
        if (local_60 - 1 < 2) {
          bVar6 = 2;
          bVar3 = false;
        }
        else {
          lVar4 = 0;
          bVar3 = false;
          do {
            bVar1 = (ustring->_M_dataplus)._M_p[lVar4 + 1];
            bVar6 = 4;
            if (9 < (byte)(bVar1 - 0x30)) {
              bVar6 = 1;
              uVar5 = bVar1 - 0x28;
              if (uVar5 < 0x3e) {
                if ((0x40000000000087U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
                  if ((0x2000000000000060U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_0041a00e;
                }
                else {
                  bVar3 = true;
                }
                bVar6 = 0;
              }
            }
LAB_0041a00e:
            if ((bVar6 & 3) != 0) goto LAB_0041a02c;
            lVar4 = lVar4 + 1;
          } while (local_60 - 2 != lVar4);
          bVar6 = 2;
        }
LAB_0041a02c:
        local_58 = NAN;
        if (bVar6 == 2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_48,ustring,1,local_60 - 2);
          local_50 = 0;
          if (bVar3) {
            local_58 = generateLeadingNumber(&local_48,&local_50);
          }
          else {
            local_58 = getDoubleFromString(&local_48,&local_50);
          }
          bVar6 = local_50 < local_48._M_string_length;
          if (!(bool)bVar6) {
            *index = local_60;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
        }
        dVar7 = NAN;
        bVar3 = bVar6 == 0;
      }
    }
    else {
      bVar3 = false;
      dVar7 = NAN;
    }
    if (!bVar3) {
      return dVar7;
    }
  }
  else {
    local_58 = getDoubleFromString(ustring,index);
  }
  if (((!NAN(local_58)) && (uVar2 = *index, uVar2 < ustring->_M_string_length)) &&
     ((ustring->_M_dataplus)._M_p[uVar2] == '^')) {
    local_60 = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_48,ustring,uVar2 + 1,0xffffffffffffffff);
    dVar7 = getNumberBlock(&local_48,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      local_28 = dVar7;
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      dVar7 = local_28;
    }
    if (NAN(dVar7)) {
      *index = 0;
      local_58 = NAN;
    }
    else {
      *index = local_60 + *index + 1;
      local_58 = pow(local_58,dVar7);
    }
  }
  return local_58;
}

Assistant:

static double getNumberBlock(const std::string& ustring, size_t& index) noexcept
{
    double val{constants::invalid_conversion};
    if (ustring.front() == '(') {
        size_t ival{1};
        if (segmentcheck(ustring, ')', ival)) {
            if (ival == 2) {
                index = ival;
                return 1.0;
            }
            bool hasOp = false;
            for (size_t ii = 1; ii < ival - 1; ++ii) {
                auto c = ustring[ii];
                if (c >= '0' && c <= '9') {
                    continue;
                }
                switch (c) {
                    case '-':
                    case '.':
                    case 'e':
                        break;
                    case '*':
                    case '/':
                    case '^':
                    case '(':
                    case ')':
                        hasOp = true;
                        break;
                    default:
                        return constants::invalid_conversion;
                }
            }
            auto substr = ustring.substr(1, ival - 2);
            size_t ind{0};
            if (hasOp) {
                val = generateLeadingNumber(substr, ind);
            } else {
                val = getDoubleFromString(substr, &ind);
            }
            if (ind < substr.size()) {
                return constants::invalid_conversion;
            }
            index = ival;
        } else {
            return constants::invalid_conversion;
        }
    } else {
        val = getDoubleFromString(ustring, &index);
    }
    if (!std::isnan(val) && index < ustring.size()) {
        if (ustring[index] == '^') {
            size_t nindex{0};
            double pval = getNumberBlock(ustring.substr(index + 1), nindex);
            if (!std::isnan(pval)) {
                index += nindex + 1;
                return std::pow(val, pval);
            }
            index = 0;
            return constants::invalid_conversion;
        }
    }
    return val;
}